

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O3

uint64_t helper_neon_negl_u16_aarch64(uint64_t x)

{
  return (ulong)(-(uint)x & 0xffff) - (x & 0xffff000000000000) | (ulong)-((uint)x & 0xffff0000) |
         -(x & 0xffff00000000) & 0xffff00000000;
}

Assistant:

uint64_t HELPER(neon_negl_u16)(uint64_t x)
{
    uint16_t tmp;
    uint64_t result;
#ifdef _MSC_VER
    result = (uint16_t)(0 - x);
    tmp = 0 - (x >> 16);
    result |= (uint64_t)tmp << 16;
    tmp = 0 - (x >> 32);
    result |= (uint64_t)tmp << 32;
    tmp = 0 - (x >> 48);
#else
    result = (uint16_t)-x;
    tmp = -(x >> 16);
    result |= (uint64_t)tmp << 16;
    tmp = -(x >> 32);
    result |= (uint64_t)tmp << 32;
    tmp = -(x >> 48);
#endif
    result |= (uint64_t)tmp << 48;
    return result;
}